

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kparser.cpp
# Opt level: O0

int __thiscall KParser::_if(KParser *this,int begin,BlockInfo *bi)

{
  int iVar1;
  reference pvVar2;
  allocator local_1e1;
  string local_1e0 [32];
  string local_1c0 [39];
  allocator local_199;
  string local_198 [36];
  undefined4 local_174;
  BlockInfo local_170;
  allocator local_129;
  string local_128 [32];
  string local_108 [39];
  allocator local_e1;
  string local_e0 [32];
  __cxx11 local_c0 [32];
  string local_a0 [8];
  string eLabel;
  BlockInfo local_70;
  int local_30;
  int local_2c;
  int t;
  int i;
  BlockInfo *bi_local;
  KParser *pKStack_18;
  int begin_local;
  KParser *this_local;
  
  local_30 = 0;
  local_2c = begin;
  _t = bi;
  bi_local._4_4_ = begin;
  pKStack_18 = this;
  pvVar2 = std::vector<Token,_std::allocator<Token>_>::operator[](&this->m_tokens,(long)begin);
  if (pvVar2->tokenType == _if) {
    iVar1 = local_2c + 1;
    local_2c = iVar1;
    BlockInfo::BlockInfo(&local_70,bi);
    iVar1 = _expr(this,iVar1,&local_70);
    local_30 = iVar1;
    BlockInfo::~BlockInfo(&local_70);
    if (iVar1 < 0) {
      this_local._4_4_ = -1;
    }
    else {
      local_2c = local_30;
      iVar1 = this->m_labelNumber;
      this->m_labelNumber = iVar1 + 1;
      std::__cxx11::to_string(local_c0,iVar1);
      std::operator+((char *)local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12a82b);
      std::__cxx11::string::~string((string *)local_c0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e0,"jz",&local_e1);
      std::__cxx11::string::string(local_108,local_a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,"",&local_129);
      addCode(this,(string *)local_e0,(string *)local_108,(string *)local_128);
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      iVar1 = local_2c;
      BlockInfo::BlockInfo(&local_170,bi);
      iVar1 = _block(this,iVar1,&local_170);
      local_30 = iVar1;
      BlockInfo::~BlockInfo(&local_170);
      if (iVar1 < 0) {
        this_local._4_4_ = -1;
      }
      else {
        local_2c = local_30;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_198,"label",&local_199);
        std::__cxx11::string::string(local_1c0,local_a0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1e0,"",&local_1e1);
        addCode(this,(string *)local_198,(string *)local_1c0,(string *)local_1e0);
        std::__cxx11::string::~string(local_1e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
        std::__cxx11::string::~string(local_1c0);
        std::__cxx11::string::~string(local_198);
        std::allocator<char>::~allocator((allocator<char> *)&local_199);
        this_local._4_4_ = local_2c;
      }
      local_174 = 1;
      std::__cxx11::string::~string(local_a0);
    }
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int KParser::_if(int begin,  BlockInfo bi) {
    int i = begin;
    int t = 0;
    if( m_tokens[i].tokenType != TokenType::_if ) {
        return -1;
    }
    i++;

    if((t = _expr(i, bi)) < 0) {
        return -1;
    } else {
        i = t;
    } 
    std::string eLabel = "LABEL" + std::to_string(m_labelNumber++);

    addCode("jz", eLabel, "");
    if((t = _block(i, bi)) < 0) {
        return -1;
    } else {
        i = t;
    }
    addCode("label", eLabel, "");
    return i;
}